

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_depth_decomposition.h
# Opt level: O3

ArrayIDIDFunc *
compute_tree_depth_order_of_connected_graph<flow_cutter::ComputeSeparator>
          (ArrayIDIDFunc *__return_storage_ptr__,ArrayIDIDFunc *tail,ArrayIDIDFunc *head,
          ComputeSeparator *compute_separator,int tree_depth_must_be_below)

{
  undefined1 auVar1 [32];
  uint uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int best_order_depth;
  ArrayIDIDFunc nd_order;
  vector<int,_std::allocator<int>_> separator;
  int local_98;
  int local_94;
  ArrayIDIDFunc local_90;
  ArrayIDIDFunc local_78;
  vector<int,_std::allocator<int>_> local_60;
  anon_class_24_3_8acad44f local_48;
  
  iVar6 = (tail->super_ArrayIDFunc<int>).preimage_count_;
  uVar2 = tail->image_count_;
  local_94 = tree_depth_must_be_below;
  if (iVar6 == uVar2 * 2 + -2) {
    compute_tree_depth_order_of_tree<ArrayIDIDFunc,ArrayIDIDFunc>(__return_storage_ptr__,tail,head);
  }
  else if (iVar6 == (uVar2 - 1) * uVar2) {
    (__return_storage_ptr__->super_ArrayIDFunc<int>).preimage_count_ = uVar2;
    if (uVar2 == 0) {
      (__return_storage_ptr__->super_ArrayIDFunc<int>).data_ = (int *)0x0;
      __return_storage_ptr__->image_count_ = 0;
    }
    else {
      uVar9 = 0xffffffffffffffff;
      if (-1 < (int)uVar2) {
        uVar9 = (ulong)uVar2 * 4;
      }
      piVar7 = (int *)operator_new__(uVar9);
      (__return_storage_ptr__->super_ArrayIDFunc<int>).data_ = piVar7;
      __return_storage_ptr__->image_count_ = uVar2;
      if (0 < (int)uVar2) {
        auVar11 = vpbroadcastq_avx512vl();
        auVar4 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar5 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar3 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
        lVar8 = 0;
        auVar12._8_8_ = 8;
        auVar12._0_8_ = 8;
        auVar12._16_8_ = 8;
        auVar12._24_8_ = 8;
        auVar13._8_4_ = 8;
        auVar13._0_8_ = 0x800000008;
        auVar13._12_4_ = 8;
        auVar13._16_4_ = 8;
        auVar13._20_4_ = 8;
        auVar13._24_4_ = 8;
        auVar13._28_4_ = 8;
        do {
          vpcmpuq_avx512vl(auVar5,auVar11,2);
          vpcmpuq_avx512vl(auVar4,auVar11,2);
          auVar1 = vmovdqu32_avx512vl(auVar3);
          *(undefined1 (*) [32])((long)piVar7 + lVar8) = auVar1;
          auVar5 = vpaddq_avx2(auVar5,auVar12);
          auVar4 = vpaddq_avx2(auVar4,auVar12);
          auVar3 = vpaddd_avx2(auVar3,auVar13);
          lVar8 = lVar8 + 0x20;
        } while ((ulong)(uVar2 + 7 >> 3) << 5 != lVar8);
      }
    }
  }
  else {
    compute_greedy_order(&local_90,tail,head);
    iVar6 = compute_tree_depth_of_order(tail,head,&local_90);
    iVar10 = iVar6;
    if (tree_depth_must_be_below <= iVar6) {
      iVar10 = tree_depth_must_be_below;
    }
    local_98 = iVar6;
    flow_cutter::ComputeSeparator::operator()(&local_60,compute_separator,tail,head,iVar10 + -1);
    if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      local_48.tree_depth_must_be_below = &local_94;
      local_48.compute_separator = compute_separator;
      local_48.best_order_depth = &local_98;
      compute_nested_disection_order_by_splitting_along_separator<compute_tree_depth_order_of_connected_graph<flow_cutter::ComputeSeparator>(ArrayIDIDFunc,ArrayIDIDFunc,flow_cutter::ComputeSeparator_const&,int)::_lambda(ArrayIDIDFunc,ArrayIDIDFunc)_1_>
                (&local_78,tail,head,&local_60,&local_48);
      if ((local_78.super_ArrayIDFunc<int>.preimage_count_ != 0) &&
         (iVar6 = compute_tree_depth_of_order(tail,head,&local_78), iVar6 < local_98)) {
        if (local_90.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
          operator_delete__(local_90.super_ArrayIDFunc<int>.data_);
        }
        local_90.super_ArrayIDFunc<int>.preimage_count_ =
             local_78.super_ArrayIDFunc<int>.preimage_count_;
        local_78.super_ArrayIDFunc<int>.preimage_count_ = 0;
        local_90.super_ArrayIDFunc<int>.data_ = local_78.super_ArrayIDFunc<int>.data_;
        local_78.super_ArrayIDFunc<int>.data_ = (int *)0x0;
        local_90.image_count_ = local_78.image_count_;
        local_98 = iVar6;
      }
      tree_depth_must_be_below = local_94;
      iVar6 = local_98;
      if (local_78.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
        operator_delete__(local_78.super_ArrayIDFunc<int>.data_);
        tree_depth_must_be_below = local_94;
        iVar6 = local_98;
      }
    }
    piVar7 = local_90.super_ArrayIDFunc<int>.data_;
    iVar10 = local_90.super_ArrayIDFunc<int>.preimage_count_;
    if (tree_depth_must_be_below < iVar6) {
      iVar10 = 0;
      piVar7 = (int *)0x0;
      iVar6 = 0;
    }
    else {
      local_90.super_ArrayIDFunc<int>.preimage_count_ = 0;
      local_90.super_ArrayIDFunc<int>.data_ = (int *)0x0;
      iVar6 = local_90.image_count_;
    }
    (__return_storage_ptr__->super_ArrayIDFunc<int>).preimage_count_ = iVar10;
    (__return_storage_ptr__->super_ArrayIDFunc<int>).data_ = piVar7;
    __return_storage_ptr__->image_count_ = iVar6;
    if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_90.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
      operator_delete__(local_90.super_ArrayIDFunc<int>.data_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ArrayIDIDFunc compute_tree_depth_order_of_connected_graph(
    ArrayIDIDFunc tail, ArrayIDIDFunc head,
    const ComputeSeparator& compute_separator,
    int tree_depth_must_be_below)
{
    assert(tail.preimage_count() == head.preimage_count());
    assert(tail.image_count() == head.image_count());
    assert(is_symmetric(tail, head));

    const int node_count = tail.image_count();
    const int arc_count = tail.preimage_count();
    bool is_tree = (arc_count == 2 * (node_count - 1));
    bool is_clique = (arc_count == (node_count) * (node_count - 1));

    if (is_tree) {
        return compute_tree_depth_order_of_tree(std::move(tail), std::move(head));
    } else if (is_clique) {
        return identity_permutation(node_count);
    } else {
        ArrayIDIDFunc best_order = compute_greedy_order(tail, head);
        int best_order_depth = compute_tree_depth_of_order(tail, head, best_order);

        // If we computed a separator with size tree_depth_must_be_below or more, then the tree depth would also be at least tree_depth_must_be_below as the separator forms a path.
        // If we computed a separator with size best_order_depth or more, then it cannot be better than best_order_depth as the separator forms a path.
        std::vector<int> separator = compute_separator(tail, head, std::min(tree_depth_must_be_below, best_order_depth) - 1);
        if (!separator.empty()) {
            ArrayIDIDFunc nd_order = compute_nested_disection_order_by_splitting_along_separator(
                tail, head, separator,
                [&](ArrayIDIDFunc sub_tail, ArrayIDIDFunc sub_head) {
                    return compute_tree_depth_order_of_connected_graph(std::move(sub_tail), std::move(sub_head), compute_separator, std::min(tree_depth_must_be_below, best_order_depth) - 1);
                });
            if(nd_order.preimage_count() != 0){
                int nd_order_depth = compute_tree_depth_of_order(tail, head, nd_order);
                if (nd_order_depth < best_order_depth) {
                    best_order = std::move(nd_order);
                    best_order_depth = nd_order_depth;
                }
            }
        }

        if(best_order_depth > tree_depth_must_be_below)
            return ArrayIDIDFunc();
        else
            return std::move(best_order);
    }
}